

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

bool bloaty::DoParseOptions
               (bool skip_unknown,int *argc,char ***argv,Options *options,
               OutputOptions *output_options)

{
  byte *pbVar1;
  ShowDomain SVar2;
  char *pcVar3;
  char **ppcVar4;
  FILE *__stream;
  size_t sVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  size_type __rlen;
  Options_SortBy value;
  undefined7 in_register_00000039;
  uint uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  string *psVar13;
  bool bVar14;
  string_view sVar15;
  string_view flag;
  string_view flag_00;
  string_view flag_01;
  string_view flag_02;
  string_view flag_03;
  string_view flag_04;
  string_view flag_05;
  string_view flag_06;
  string_view flag_07;
  string_view flag_08;
  string_view flag_09;
  string_view flag_10;
  string_view flag_11;
  string_view flag_12;
  string_view flag_13;
  string_view flag_14;
  string_view flag_15;
  string_view flag_16;
  string_view flag_17;
  string_view flag_18;
  string_view flag_19;
  string_view flag_20;
  string_view flag_21;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view option;
  IstreamInputStream stream;
  uint64_t uint64_option;
  int int_option;
  ArgParser args;
  ifstream input_file;
  string_view local_388;
  uint local_36c;
  OutputOptions *local_368;
  IstreamInputStream local_360;
  char *local_310;
  uint64 local_308;
  undefined4 local_300;
  int local_2fc;
  ArenaStringPtr *local_2f8;
  _func_int **local_2f0;
  ArgParser local_2e8;
  RepeatedPtrFieldBase *local_2b0;
  RepeatedPtrFieldBase *local_2a8;
  RepeatedPtrFieldBase *local_2a0;
  ArenaStringPtr *local_298;
  RepeatedPtrFieldBase *local_290;
  string local_288;
  string_view local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248 [31];
  string local_50;
  
  local_368 = output_options;
  ArgParser::ArgParser(&local_2e8,argc,argv);
  local_388._M_len = 0;
  local_388._M_str = (char *)0x0;
  bVar14 = local_2e8.index_ == local_2e8.argc_;
  uVar12 = 0;
  if (bVar14) {
LAB_001863bc:
    if (((options->data_source_).super_RepeatedPtrFieldBase.current_size_ == 0) &&
       (((options->_has_bits_).has_bits_[0] & 1) == 0)) {
      Options::add_data_source(options,"sections");
    }
    if (((uVar12 & 1) != 0) && (((options->_has_bits_).has_bits_[0] & 8) == 0)) {
      SVar2 = local_368->show;
      if (SVar2 == kShowBoth) {
        bVar9 = Options_SortBy_IsValid(0);
        if (!bVar9) {
LAB_00186611:
          __assert_fail("::bloaty::Options_SortBy_IsValid(value)",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/build_O1/src/bloaty.pb.h"
                        ,0x594,
                        "void bloaty::Options::_internal_set_sort_by(::bloaty::Options_SortBy)");
        }
        *(byte *)(options->_has_bits_).has_bits_ = (byte)(options->_has_bits_).has_bits_[0] | 8;
        options->sort_by_ = 0;
      }
      else if (SVar2 == kShowVM) {
        bVar9 = Options_SortBy_IsValid(1);
        if (!bVar9) goto LAB_00186611;
        *(byte *)(options->_has_bits_).has_bits_ = (byte)(options->_has_bits_).has_bits_[0] | 8;
        options->sort_by_ = 1;
      }
      else if (SVar2 == kShowFile) {
        bVar9 = Options_SortBy_IsValid(2);
        if (!bVar9) goto LAB_00186611;
        *(byte *)(options->_has_bits_).has_bits_ = (byte)(options->_has_bits_).has_bits_[0] | 8;
        options->sort_by_ = 2;
      }
    }
LAB_0018645a:
    if (local_2e8.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2e8.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2e8.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e8.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return bVar14;
  }
  local_300 = (undefined4)CONCAT71(in_register_00000039,skip_unknown);
  local_2a8 = &(options->filename_).super_RepeatedPtrFieldBase;
  local_2b0 = &(options->base_filename_).super_RepeatedPtrFieldBase;
  local_2a0 = &(options->source_map_).super_RepeatedPtrFieldBase;
  local_298 = &options->source_filter_;
  local_2f8 = &options->disassemble_function_;
  local_290 = &(options->debug_filename_).super_RepeatedPtrFieldBase;
  local_310 = "\'--\' option should only be specified once";
  local_2f0 = (_func_int **)&PTR__IstreamInputStream_0067e3a0;
  bVar9 = false;
  local_36c = 0;
LAB_001859da:
  sVar15._M_str = "--";
  sVar15._M_len = 2;
  bVar6 = ArgParser::TryParseFlag(&local_2e8,sVar15);
  if (bVar6) {
    bVar6 = true;
    if (bVar9) {
      iVar10 = 0x850;
      goto LAB_00186494;
    }
  }
  else {
    flag._M_str = "--csv";
    flag._M_len = 5;
    bVar7 = ArgParser::TryParseFlag(&local_2e8,flag);
    bVar6 = bVar9;
    if (bVar7) {
      local_368->output_format = kCSV;
    }
    else {
      flag_00._M_str = "--tsv";
      flag_00._M_len = 5;
      bVar7 = ArgParser::TryParseFlag(&local_2e8,flag_00);
      if (bVar7) {
        local_368->output_format = kTSV;
      }
      else {
        flag_01._M_str = "--raw-map";
        flag_01._M_len = 9;
        bVar7 = ArgParser::TryParseFlag(&local_2e8,flag_01);
        if (bVar7) {
          *(byte *)(options->_has_bits_).has_bits_ = (byte)(options->_has_bits_).has_bits_[0] | 0x20
          ;
          options->dump_raw_map_ = true;
        }
        else {
          flag_02._M_str = "-c";
          flag_02._M_len = 2;
          bVar7 = ArgParser::TryParseOption(&local_2e8,flag_02,&local_388);
          if (bVar7) {
            local_360.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream =
                 (_func_int **)&local_360.copying_input_.input_;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_360,local_388._M_str,
                       (char *)(local_388._M_len + (long)local_388._M_str));
            std::ifstream::ifstream((Type *)&local_258,(string *)&local_360,_S_in);
            if ((istream **)local_360.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream !=
                &local_360.copying_input_.input_) {
              operator_delete(local_360.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream,
                              CONCAT71(local_360.copying_input_.input_._1_7_,
                                       local_360.copying_input_.input_._0_1_) + 1);
            }
            cVar8 = std::__basic_file<char>::is_open();
            if (cVar8 == '\0') {
              local_360.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream =
                   (_func_int **)local_388._M_len;
              local_360.copying_input_.super_CopyingInputStream._vptr_CopyingInputStream =
                   (_func_int **)local_388._M_str;
              format._M_str = (char *)&local_360;
              format._M_len = (size_t)"couldn\'t open file $0";
              absl::Substitute_abi_cxx11_(&local_288,(absl *)0x15,format,(Arg *)output_options);
              Throw(local_288._M_dataplus._M_p,0x85c);
            }
            google::protobuf::io::IstreamInputStream::IstreamInputStream
                      (&local_360,(istream *)&local_258,-1);
            bVar14 = google::protobuf::TextFormat::Merge
                               (&local_360.super_ZeroCopyInputStream,&options->super_Message);
            if (!bVar14) {
              local_288._M_dataplus._M_p = (pointer)local_388._M_len;
              local_288._M_string_length = (size_type)local_388._M_str;
              format_00._M_str = (char *)&local_288;
              format_00._M_len = (size_t)"error parsing configuration out of file $0";
              absl::Substitute_abi_cxx11_(&local_50,(absl *)0x2a,format_00,(Arg *)output_options);
              Throw(local_50._M_dataplus._M_p,0x860);
            }
            local_360.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream = local_2f0;
            google::protobuf::io::CopyingInputStreamAdaptor::~CopyingInputStreamAdaptor
                      (&local_360.impl_);
            google::protobuf::io::IstreamInputStream::CopyingIstreamInputStream::
            ~CopyingIstreamInputStream(&local_360.copying_input_);
            std::ifstream::~ifstream((Type *)&local_258);
          }
          else {
            flag_03._M_str = "-d";
            flag_03._M_len = 2;
            bVar7 = ArgParser::TryParseOption(&local_2e8,flag_03,&local_388);
            if (bVar7) {
              local_360.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream =
                   (_func_int **)local_388._M_len;
              local_360.copying_input_.super_CopyingInputStream._vptr_CopyingInputStream =
                   (_func_int **)local_388._M_str;
              local_360.copying_input_.input_._0_1_ = 0x2c;
              absl::strings_internal::
              Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
              ::
              ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ::operator()((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_258,
                           (ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            *)&local_288,
                           (Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                            *)&local_360);
              pcVar3 = local_258._M_str;
              for (psVar13 = (string *)local_258._M_len; psVar13 != (string *)pcVar3;
                  psVar13 = psVar13 + 1) {
                Options::add_data_source(options,psVar13);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_258);
            }
            else {
              flag_04._M_str = "-C";
              flag_04._M_len = 2;
              bVar7 = ArgParser::TryParseOption(&local_2e8,flag_04,&local_388);
              if ((bVar7) ||
                 (flag_05._M_str = "--demangle", flag_05._M_len = 10,
                 bVar7 = ArgParser::TryParseOption(&local_2e8,flag_05,&local_388), bVar7)) {
                pcVar3 = local_388._M_str;
                sVar5 = local_388._M_len;
                if ((_func_int **)local_388._M_len == (_func_int **)0x5) {
                  iVar10 = bcmp(local_388._M_str,"short",5);
                  if (iVar10 != 0) goto LAB_0018650f;
                  bVar14 = Options_Demangle_IsValid(0);
                  if (!bVar14) goto LAB_00186630;
                  *(byte *)(options->_has_bits_).has_bits_ =
                       (byte)(options->_has_bits_).has_bits_[0] | 4;
                  options->demangle_ = 0;
                }
                else {
                  if ((_func_int **)local_388._M_len != (_func_int **)0x4) {
LAB_0018650f:
                    local_258._M_str = pcVar3;
                    local_258._M_len = sVar5;
                    format_01._M_str = (char *)&local_258;
                    format_01._M_len = (size_t)"unknown value for --demangle: $0";
                    absl::Substitute_abi_cxx11_
                              ((string *)&local_360,(absl *)0x20,format_01,(Arg *)output_options);
                    Throw((char *)local_360.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream,
                          0x870);
                  }
                  iVar10 = bcmp(local_388._M_str,"none",4);
                  if (iVar10 == 0) {
                    bVar14 = Options_Demangle_IsValid(2);
                    if (!bVar14) {
LAB_00186630:
                      __assert_fail("::bloaty::Options_Demangle_IsValid(value)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/build_O1/src/bloaty.pb.h"
                                    ,0x577,
                                    "void bloaty::Options::_internal_set_demangle(::bloaty::Options_Demangle)"
                                   );
                    }
                    *(byte *)(options->_has_bits_).has_bits_ =
                         (byte)(options->_has_bits_).has_bits_[0] | 4;
                    options->demangle_ = 2;
                  }
                  else {
                    iVar10 = bcmp(pcVar3,"full",4);
                    if (iVar10 != 0) goto LAB_0018650f;
                    bVar14 = Options_Demangle_IsValid(1);
                    if (!bVar14) goto LAB_00186630;
                    *(byte *)(options->_has_bits_).has_bits_ =
                         (byte)(options->_has_bits_).has_bits_[0] | 4;
                    options->demangle_ = 1;
                  }
                }
              }
              else {
                flag_06._M_str = "--debug-file";
                flag_06._M_len = 0xc;
                bVar7 = ArgParser::TryParseOption(&local_2e8,flag_06,&local_388);
                if (bVar7) {
                  local_258._M_len = (size_t)local_248;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_258,local_388._M_str,
                             (char *)(local_388._M_len + (long)local_388._M_str));
                  google::protobuf::internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::TypeHandler,_nullptr>
                            (local_290,(Type *)&local_258);
                  goto LAB_00185d3c;
                }
                flag_07._M_str = "--debug-fileoff";
                flag_07._M_len = 0xf;
                bVar7 = ArgParser::TryParseUint64Option(&local_2e8,flag_07,&local_308);
                if (bVar7) {
                  uVar12 = (options->_has_bits_).has_bits_[0];
                  if ((char)uVar12 < '\0') {
                    iVar10 = 0x876;
                    local_310 = "currently we only support a single debug fileoff";
LAB_00186494:
                    Throw(local_310,iVar10);
                  }
                  (options->_has_bits_).has_bits_[0] = uVar12 | 0x80;
                  options->debug_fileoff_ = local_308;
                }
                else {
                  flag_08._M_str = "--debug-vmaddr";
                  flag_08._M_len = 0xe;
                  bVar7 = ArgParser::TryParseUint64Option(&local_2e8,flag_08,&local_308);
                  if (bVar7) {
                    uVar12 = (options->_has_bits_).has_bits_[0];
                    if ((uVar12 & 0x40) != 0) {
                      iVar10 = 0x87b;
                      local_310 = "currently we only support a single debug vmaddr";
                      goto LAB_00186494;
                    }
                    (options->_has_bits_).has_bits_[0] = uVar12 | 0x40;
                    options->debug_vmaddr_ = local_308;
                  }
                  else {
                    flag_09._M_str = "--disassemble";
                    flag_09._M_len = 0xd;
                    bVar7 = ArgParser::TryParseOption(&local_2e8,flag_09,&local_388);
                    if (bVar7) {
                      *(byte *)(options->_has_bits_).has_bits_ =
                           (byte)(options->_has_bits_).has_bits_[0] | 1;
                      if ((options->disassemble_function_).ptr_ ==
                          (string *)
                          &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
                        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                                  (local_2f8,
                                   (string *)
                                   &google::protobuf::internal::
                                    fixed_address_empty_string_abi_cxx11_);
                      }
                      psVar13 = local_2f8->ptr_;
                      local_258._M_len = (size_t)local_248;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_258,local_388._M_str,
                                 (char *)(local_388._M_len + (long)local_388._M_str));
                      std::__cxx11::string::operator=((string *)psVar13,(string *)&local_258);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_258._M_len != local_248) {
                        operator_delete((void *)local_258._M_len,
                                        local_248[0]._M_allocated_capacity + 1);
                      }
                    }
                    else {
                      flag_10._M_str = "-n";
                      flag_10._M_len = 2;
                      bVar7 = ArgParser::TryParseIntegerOption(&local_2e8,flag_10,&local_2fc);
                      if (bVar7) {
                        lVar11 = (long)local_2fc;
                        if (lVar11 == 0) {
                          pbVar1 = (byte *)((long)(options->_has_bits_).has_bits_ + 1);
                          *pbVar1 = *pbVar1 | 1;
                          lVar11 = 0x7fffffffffffffff;
                        }
                        else {
                          pbVar1 = (byte *)((long)(options->_has_bits_).has_bits_ + 1);
                          *pbVar1 = *pbVar1 | 1;
                        }
                        options->max_rows_per_level_ = lVar11;
                      }
                      else {
                        flag_11._M_str = "--domain";
                        flag_11._M_len = 8;
                        bVar7 = ArgParser::TryParseOption(&local_2e8,flag_11,&local_388);
                        pcVar3 = local_388._M_str;
                        sVar5 = local_388._M_len;
                        if (bVar7) {
                          if ((_func_int **)local_388._M_len == (_func_int **)0x4) {
                            iVar10 = bcmp(local_388._M_str,"file",4);
                            if (iVar10 == 0) {
                              show = kShowFile;
                            }
                            else {
                              iVar10 = bcmp(pcVar3,"both",4);
                              if (iVar10 != 0) goto LAB_00186673;
                              show = kShowBoth;
                            }
                          }
                          else {
                            if (((_func_int **)local_388._M_len != (_func_int **)0x2) ||
                               (iVar10 = bcmp(local_388._M_str,"vm",2), iVar10 != 0)) {
LAB_00186673:
                              local_258._M_str = pcVar3;
                              local_258._M_len = sVar5;
                              format_02._M_str = (char *)&local_258;
                              format_02._M_len = (size_t)"unknown value for --domain: $0";
                              absl::Substitute_abi_cxx11_
                                        ((string *)&local_360,(absl *)0x1e,format_02,
                                         (Arg *)output_options);
                              Throw((char *)local_360.super_ZeroCopyInputStream.
                                            _vptr_ZeroCopyInputStream,0x88f);
                            }
                            show = kShowVM;
                          }
                          local_368->show = show;
                          local_36c = (uint)CONCAT71((int7)((ulong)local_368 >> 8),1);
                        }
                        else {
                          flag_12._M_str = "-s";
                          flag_12._M_len = 2;
                          bVar7 = ArgParser::TryParseOption(&local_2e8,flag_12,&local_388);
                          pcVar3 = local_388._M_str;
                          sVar5 = local_388._M_len;
                          if (bVar7) {
                            if ((_func_int **)local_388._M_len == (_func_int **)0x4) {
                              iVar10 = bcmp(local_388._M_str,"file",4);
                              if (iVar10 == 0) {
                                value = Options_SortBy_SORTBY_FILESIZE;
                              }
                              else {
                                iVar10 = bcmp(pcVar3,"both",4);
                                value = Options_SortBy_SORTBY_BOTH;
                                if (iVar10 != 0) goto LAB_001866a7;
                              }
                            }
                            else {
                              if (((_func_int **)local_388._M_len != (_func_int **)0x2) ||
                                 (iVar10 = bcmp(local_388._M_str,"vm",2), iVar10 != 0)) {
LAB_001866a7:
                                local_258._M_str = pcVar3;
                                local_258._M_len = sVar5;
                                format_03._M_str = (char *)&local_258;
                                format_03._M_len = (size_t)"unknown value for -s: $0";
                                absl::Substitute_abi_cxx11_
                                          ((string *)&local_360,(absl *)0x18,format_03,
                                           (Arg *)output_options);
                                Throw((char *)local_360.super_ZeroCopyInputStream.
                                              _vptr_ZeroCopyInputStream,0x899);
                              }
                              value = Options_SortBy_SORTBY_VMSIZE;
                            }
                            Options::set_sort_by(options,value);
                          }
                          else {
                            flag_13._M_str = "--source-filter";
                            flag_13._M_len = 0xf;
                            bVar7 = ArgParser::TryParseOption(&local_2e8,flag_13,&local_388);
                            if (bVar7) {
                              local_258._M_len = (size_t)local_248;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_258,local_388._M_str,
                                         (char *)(local_388._M_len + (long)local_388._M_str));
                              *(byte *)(options->_has_bits_).has_bits_ =
                                   (byte)(options->_has_bits_).has_bits_[0] | 2;
                              google::protobuf::internal::ArenaStringPtr::SetNoArena
                                        (local_298,
                                         (string *)
                                         &google::protobuf::internal::
                                          fixed_address_empty_string_abi_cxx11_,(string *)&local_258
                                        );
                            }
                            else {
                              flag_14._M_str = "--source-map";
                              flag_14._M_len = 0xc;
                              bVar7 = ArgParser::TryParseOption(&local_2e8,flag_14,&local_388);
                              if (!bVar7) {
                                flag_15._M_str = "-v";
                                flag_15._M_len = 2;
                                bVar7 = ArgParser::TryParseFlag(&local_2e8,flag_15);
                                if (bVar7) {
                                  *(byte *)(options->_has_bits_).has_bits_ =
                                       (byte)(options->_has_bits_).has_bits_[0] | 0x10;
                                  options->verbose_level_ = 1;
                                }
                                else {
                                  flag_16._M_str = "-vv";
                                  flag_16._M_len = 3;
                                  bVar7 = ArgParser::TryParseFlag(&local_2e8,flag_16);
                                  if (bVar7) {
                                    *(byte *)(options->_has_bits_).has_bits_ =
                                         (byte)(options->_has_bits_).has_bits_[0] | 0x10;
                                    options->verbose_level_ = 2;
                                  }
                                  else {
                                    flag_17._M_str = "-vvv";
                                    flag_17._M_len = 4;
                                    bVar7 = ArgParser::TryParseFlag(&local_2e8,flag_17);
                                    if (bVar7) {
                                      *(byte *)(options->_has_bits_).has_bits_ =
                                           (byte)(options->_has_bits_).has_bits_[0] | 0x10;
                                      options->verbose_level_ = 3;
                                    }
                                    else {
                                      flag_18._M_str = "-w";
                                      flag_18._M_len = 2;
                                      bVar7 = ArgParser::TryParseFlag(&local_2e8,flag_18);
                                      if (!bVar7) {
                                        flag_19._M_str = "--list-sources";
                                        flag_19._M_len = 0xe;
                                        bVar7 = ArgParser::TryParseFlag(&local_2e8,flag_19);
                                        if (bVar7) {
                                          lVar11 = 0x10;
                                          do {
                                            __stream = _stderr;
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&local_360,
                                                       *(char **)(&UNK_0062bed8 + lVar11),
                                                       (allocator<char> *)&local_288);
                                            anon_unknown_35::FixedWidthString
                                                      ((string *)&local_258,(string *)&local_360,0xf
                                                      );
                                            fprintf(__stream,"%s %s\n",local_258._M_len,
                                                    *(undefined8 *)(data_sources + lVar11));
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_258._M_len != local_248) {
                                              operator_delete((void *)local_258._M_len,
                                                              local_248[0]._M_allocated_capacity + 1
                                                             );
                                            }
                                            if ((istream **)
                                                local_360.super_ZeroCopyInputStream.
                                                _vptr_ZeroCopyInputStream !=
                                                &local_360.copying_input_.input_) {
                                              operator_delete(local_360.super_ZeroCopyInputStream.
                                                              _vptr_ZeroCopyInputStream,
                                                              CONCAT71(local_360.copying_input_.
                                                                       input_._1_7_,
                                                                       local_360.copying_input_.
                                                                       input_._0_1_) + 1);
                                            }
                                            lVar11 = lVar11 + 0x18;
                                          } while (lVar11 != 0x100);
                                          goto LAB_0018645a;
                                        }
                                        flag_20._M_str = "--help";
                                        flag_20._M_len = 6;
                                        bVar7 = ArgParser::TryParseFlag(&local_2e8,flag_20);
                                        if (!bVar7) {
                                          flag_21._M_str = "--version";
                                          flag_21._M_len = 9;
                                          bVar14 = ArgParser::TryParseFlag(&local_2e8,flag_21);
                                          if (bVar14) {
                                            puts("Bloaty McBloatface 1.1");
                                            exit(0);
                                          }
                                          sVar15 = ArgParser::Arg(&local_2e8);
                                          if ((sVar15._M_len == 0) || (*sVar15._M_str != '-')) {
                                            if (bVar9) {
                                              local_368->showAllSizesCSV = true;
                                              sVar15 = ArgParser::Arg(&local_2e8);
                                              local_2e8.index_ = local_2e8.index_ + 1;
                                              local_258._M_len = (size_t)local_248;
                                              std::__cxx11::string::_M_construct<char_const*>
                                                        ((string *)&local_258,sVar15._M_str,
                                                         sVar15._M_str + sVar15._M_len);
                                              google::protobuf::internal::RepeatedPtrFieldBase::
                                              Add<google::protobuf::RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::TypeHandler,_nullptr>
                                                        (local_2b0,(Type *)&local_258);
                                            }
                                            else {
                                              sVar15 = ArgParser::Arg(&local_2e8);
                                              local_2e8.index_ = local_2e8.index_ + 1;
                                              local_258._M_len = (size_t)local_248;
                                              std::__cxx11::string::_M_construct<char_const*>
                                                        ((string *)&local_258,sVar15._M_str,
                                                         sVar15._M_str + sVar15._M_len);
                                              google::protobuf::internal::RepeatedPtrFieldBase::
                                              Add<google::protobuf::RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::TypeHandler,_nullptr>
                                                        (local_2a8,(Type *)&local_258);
                                            }
                                            goto LAB_00185d3c;
                                          }
                                          if ((char)local_300 == '\0') {
                                            local_258 = ArgParser::Arg(&local_2e8);
                                            format_04._M_str = (char *)&local_258;
                                            format_04._M_len = (size_t)"Unknown option: $0";
                                            absl::Substitute_abi_cxx11_
                                                      ((string *)&local_360,(absl *)0x12,format_04,
                                                       (Arg *)output_options);
                                            Throw((char *)local_360.super_ZeroCopyInputStream.
                                                          _vptr_ZeroCopyInputStream,0x8b7);
                                          }
                                          lVar11 = (long)local_2e8.index_;
                                          local_2e8.index_ = local_2e8.index_ + 1;
                                          pcVar3 = local_2e8.argv_.
                                                                                                      
                                                  super__Vector_base<char_*,_std::allocator<char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar11];
                                          ppcVar4 = *local_2e8.out_argv_;
                                          iVar10 = *local_2e8.out_argc_;
                                          *local_2e8.out_argc_ = iVar10 + 1;
                                          ppcVar4[iVar10] = pcVar3;
                                          goto LAB_00185cc4;
                                        }
                                        puts(
                                            "Bloaty McBloatface: a size profiler for binaries.\n\nUSAGE: bloaty [OPTION]... FILE... [-- BASE_FILE...]\n\nOptions:\n\n  --csv              Output in CSV format instead of human-readable.\n  --tsv              Output in TSV format instead of human-readable.\n  -c FILE            Load configuration from <file>.\n  -d SOURCE,SOURCE   Comma-separated list of sources to scan.\n  --debug-file=FILE  Use this file for debug symbols and/or symbol table.\n  --source-map=ID=FILE\n                     Use this source map file for the binary. The ID can be\n                     the build ID (or Wasm sourceMappingURL) or the file path\n                     as specified in the command line.\n                     Currently only supported for Wasm.\n  -C MODE            How to demangle symbols.  Possible values are:\n  --demangle=MODE      --demangle=none   no demangling, print raw symbols\n                       --demangle=short  demangle, but omit arg/return types\n                       --demangle=full   print full demangled type\n                     The default is --demangle=short.\n  --disassemble=FUNCTION\n                     Disassemble this function (EXPERIMENTAL)\n  --domain=DOMAIN    Which domains to show.  Possible values are:\n                       --domain=vm\n                       --domain=file\n                       --domain=both (the default)\n  -n NUM             How many rows to show per level before collapsing\n                     other keys into \'[Other]\'.  Set to \'0\' for unlimited.\n                     Defaults to 20.\n  -s SORTBY          Whether to sort by VM or File size.  Possible values\n                     are:\n                       -s vm\n                       -s file\n                       -s both (the default: sorts by max(vm, file)).\n  -w                 Wide output; don\'t truncate long labels.\n  --help             Display this message and exit.\n  --list-sources     Show a list of available sources and exit.\n  --source-filter=PATTERN\n                     Only show keys with names matching this pattern.\n\nOptions for deb..." /* TRUNCATED STRING LITERAL */
                                            );
                                        goto LAB_0018645a;
                                      }
                                      local_368->max_label_len = 0xffffffffffffffff;
                                    }
                                  }
                                }
                                goto LAB_00185cc4;
                              }
                              local_258._M_len = (size_t)local_248;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_258,local_388._M_str,
                                         (char *)(local_388._M_len + (long)local_388._M_str));
                              google::protobuf::internal::RepeatedPtrFieldBase::
                              Add<google::protobuf::RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::TypeHandler,_nullptr>
                                        (local_2a0,(Type *)&local_258);
                            }
LAB_00185d3c:
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_258._M_len != local_248) {
                              operator_delete((void *)local_258._M_len,
                                              local_248[0]._M_allocated_capacity + 1);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00185cc4:
  bVar9 = bVar6;
  bVar14 = local_2e8.index_ == local_2e8.argc_;
  uVar12 = local_36c;
  if (bVar14) goto LAB_001863bc;
  goto LAB_001859da;
}

Assistant:

bool DoParseOptions(bool skip_unknown, int* argc, char** argv[],
                    Options* options, OutputOptions* output_options) {
  bool saw_separator = false;
  ArgParser args(argc, argv);
  string_view option;
  int int_option;
  uint64_t uint64_option;
  bool has_domain = false;

  while (!args.IsDone()) {
    if (args.TryParseFlag("--")) {
      if (saw_separator) {
        THROW("'--' option should only be specified once");
      }
      saw_separator = true;
    } else if (args.TryParseFlag("--csv")) {
      output_options->output_format = OutputFormat::kCSV;
    } else if (args.TryParseFlag("--tsv")) {
      output_options->output_format = OutputFormat::kTSV;
    } else if (args.TryParseFlag("--raw-map")) {
      options->set_dump_raw_map(true);
    } else if (args.TryParseOption("-c", &option)) {
      std::ifstream input_file(std::string(option), std::ios::in);
      if (!input_file.is_open()) {
        THROWF("couldn't open file $0", option);
      }
      google::protobuf::io::IstreamInputStream stream(&input_file);
      if (!google::protobuf::TextFormat::Merge(&stream, options)) {
        THROWF("error parsing configuration out of file $0", option);
      }
    } else if (args.TryParseOption("-d", &option)) {
      std::vector<std::string> names = absl::StrSplit(option, ',');
      for (const auto& name : names) {
        options->add_data_source(name);
      }
    } else if (args.TryParseOption("-C", &option) ||
               args.TryParseOption("--demangle", &option)) {
      if (option == "none") {
        options->set_demangle(Options::DEMANGLE_NONE);
      } else if (option == "short") {
        options->set_demangle(Options::DEMANGLE_SHORT);
      } else if (option == "full") {
        options->set_demangle(Options::DEMANGLE_FULL);
      } else {
        THROWF("unknown value for --demangle: $0", option);
      }
    } else if (args.TryParseOption("--debug-file", &option)) {
      options->add_debug_filename(std::string(option));
    } else if (args.TryParseUint64Option("--debug-fileoff", &uint64_option)) {
      if (options->has_debug_fileoff()) {
        THROW("currently we only support a single debug fileoff");
      }
      options->set_debug_fileoff(uint64_option);
    } else if (args.TryParseUint64Option("--debug-vmaddr", &uint64_option)) {
      if (options->has_debug_vmaddr()) {
        THROW("currently we only support a single debug vmaddr");
      }
      options->set_debug_vmaddr(uint64_option);
    } else if (args.TryParseOption("--disassemble", &option)) {
      options->mutable_disassemble_function()->assign(std::string(option));
    } else if (args.TryParseIntegerOption("-n", &int_option)) {
      if (int_option == 0) {
        options->set_max_rows_per_level(INT64_MAX);
      } else {
        options->set_max_rows_per_level(int_option);
      }
    } else if (args.TryParseOption("--domain", &option)) {
      has_domain = true;
      if (option == "vm") {
        show = output_options->show = ShowDomain::kShowVM;
      } else if (option == "file") {
        show = output_options->show = ShowDomain::kShowFile;
      } else if (option == "both") {
        show = output_options->show = ShowDomain::kShowBoth;
      } else {
        THROWF("unknown value for --domain: $0", option);
      }
    } else if (args.TryParseOption("-s", &option)) {
      if (option == "vm") {
        options->set_sort_by(Options::SORTBY_VMSIZE);
      } else if (option == "file") {
        options->set_sort_by(Options::SORTBY_FILESIZE);
      } else if (option == "both") {
        options->set_sort_by(Options::SORTBY_BOTH);
      } else {
        THROWF("unknown value for -s: $0", option);
      }
    } else if (args.TryParseOption("--source-filter", &option)) {
      options->set_source_filter(std::string(option));
    } else if (args.TryParseOption("--source-map", &option)) {
      options->add_source_map(std::string(option));
    } else if (args.TryParseFlag("-v")) {
      options->set_verbose_level(1);
    } else if (args.TryParseFlag("-vv")) {
      options->set_verbose_level(2);
    } else if (args.TryParseFlag("-vvv")) {
      options->set_verbose_level(3);
    } else if (args.TryParseFlag("-w")) {
      output_options->max_label_len = SIZE_MAX;
    } else if (args.TryParseFlag("--list-sources")) {
      for (const auto& source : data_sources) {
        fprintf(stderr, "%s %s\n", FixedWidthString(source.name, 15).c_str(),
                source.description);
      }
      return false;
    } else if (args.TryParseFlag("--help")) {
      puts(usage);
      return false;
    } else if (args.TryParseFlag("--version")) {
      printf("Bloaty McBloatface 1.1\n");
      exit(0);
    } else if (absl::StartsWith(args.Arg(), "-")) {
      if (skip_unknown) {
        args.ConsumeAndSaveArg();
      } else {
        THROWF("Unknown option: $0", args.Arg());
      }
    } else {
      if (saw_separator) {
        output_options->showAllSizesCSV = true;
        options->add_base_filename(std::string(args.ConsumeArg()));
      } else {
        options->add_filename(std::string(args.ConsumeArg()));
      }
    }
  }

  if (options->data_source_size() == 0 &&
      !options->has_disassemble_function()) {
    // Default when no sources are specified.
    options->add_data_source("sections");
  }

  if (has_domain && !options->has_sort_by()) {
    // Default to sorting by what we are showing.
    switch (output_options->show) {
      case ShowDomain::kShowFile:
        options->set_sort_by(Options::SORTBY_FILESIZE);
        break;
      case ShowDomain::kShowVM:
        options->set_sort_by(Options::SORTBY_VMSIZE);
        break;
      case ShowDomain::kShowBoth:
        options->set_sort_by(Options::SORTBY_BOTH);
        break;
    }
  }

  return true;
}